

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateExpandDimsLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  string *psVar5;
  pointer pcVar6;
  iterator iVar7;
  bool bVar8;
  LayerUnion LVar9;
  long *plVar10;
  LogMessage *pLVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  undefined8 *puVar13;
  _Base_ptr p_Var14;
  int **ppiVar15;
  size_type *psVar16;
  long *plVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong uVar20;
  _Alloc_hider _Var21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  _Rb_tree_header *p_Var24;
  Result *pRVar25;
  int iVar26;
  string err_2;
  int a;
  vector<int,_std::allocator<int>_> axes;
  string err;
  Result r;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  string local_188;
  uint local_168;
  int local_164;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  Result *local_140;
  long *local_138 [2];
  long local_128 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  iterator iStack_110;
  int *local_108;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  undefined1 local_e8 [40];
  undefined1 local_c0 [16];
  int *local_b0;
  _Alloc_hider _Stack_a8;
  size_type *local_88;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  Result::Result((Result *)&local_88);
  validateInputCount((Result *)local_f8,layer,1,1);
  local_88 = (size_type *)local_f8;
  std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f0);
  if (local_f0._M_p != local_e8 + 8) {
    operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
  }
  bVar8 = Result::good((Result *)&local_88);
  if (bVar8) {
    validateOutputCount((Result *)local_f8,layer,1,1);
    local_88 = (size_type *)local_f8;
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f0);
    if (local_f0._M_p != local_e8 + 8) {
      operator_delete(local_f0._M_p,local_e8._8_8_ + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0x465) {
    LVar9 = layer->layer_;
  }
  else {
    LVar9.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
  }
  if (((LVar9.convolution_)->kernelsize_).current_size_ == 0) {
    psVar5 = (layer->name_).ptr_;
    pp_Var2 = &local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar6 = (psVar5->_M_dataplus)._M_p;
    local_60._M_impl._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar6,pcVar6 + psVar5->_M_string_length);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x32aac2);
    ppiVar15 = (int **)(plVar10 + 2);
    if ((int **)*plVar10 == ppiVar15) {
      local_b0 = *ppiVar15;
      _Stack_a8._M_p = (pointer)plVar10[3];
      local_c0._0_8_ = &local_b0;
    }
    else {
      local_b0 = *ppiVar15;
      local_c0._0_8_ = (int **)*plVar10;
    }
    local_c0._8_8_ = plVar10[1];
    *plVar10 = (long)ppiVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append(local_c0);
    psVar16 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar16) {
      local_e8._0_8_ = *psVar16;
      local_e8._8_8_ = plVar10[3];
      local_f8 = (undefined1  [8])local_e8;
    }
    else {
      local_e8._0_8_ = *psVar16;
      local_f8 = (undefined1  [8])*plVar10;
    }
    local_f0._M_p = (pointer)plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((int **)local_c0._0_8_ != &local_b0) {
      operator_delete((void *)local_c0._0_8_,(long)local_b0 + 1);
    }
    if ((_Base_ptr *)local_60._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)local_60._M_impl._0_8_,
                      (ulong)((long)&(local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f8);
    if (local_f8 != (undefined1  [8])local_e8) {
      operator_delete((void *)local_f8,local_e8._0_8_ + 1);
    }
    goto LAB_002e67e8;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar26 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140 = __return_storage_ptr__;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (layer->_oneof_case_[0] == 0x465) {
      LVar9 = layer->layer_;
    }
    else {
      LVar9.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
    }
    if (((LVar9.convolution_)->kernelsize_).current_size_ <= iVar26) {
      pRVar25 = local_140;
      if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
         ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_002e64e4;
      if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_c0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_f8,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_c0);
      }
      iVar26 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                       0x24);
      if ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar11 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_f8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_188,pLVar11);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_f8);
      }
      local_168 = *(uint *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                  [0] + 0x24);
      if (layer->_oneof_case_[0] == 0x465) {
        LVar9 = layer->layer_;
      }
      else {
        LVar9.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
      }
      iVar3 = ((LVar9.convolution_)->kernelsize_).current_size_;
      if (iVar26 + iVar3 == local_168) {
        local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        iStack_110._M_current = (int *)0x0;
        local_108 = (int *)0x0;
        if (iVar3 < 1) goto LAB_002e6441;
        iVar26 = 0;
        goto LAB_002e6247;
      }
      psVar5 = (layer->name_).ptr_;
      pcVar6 = (psVar5->_M_dataplus)._M_p;
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,pcVar6,pcVar6 + psVar5->_M_string_length);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_138,0,(char *)0x0,0x32aac2);
      pRVar25 = local_140;
      plVar17 = plVar10 + 2;
      if ((long *)*plVar10 == plVar17) {
        local_150 = *plVar17;
        lStack_148 = plVar10[3];
        local_160 = &local_150;
      }
      else {
        local_150 = *plVar17;
        local_160 = (long *)*plVar10;
      }
      local_158 = plVar10[1];
      *plVar10 = (long)plVar17;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
      psVar16 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_188.field_2._M_allocated_capacity = *psVar16;
        local_188.field_2._8_8_ = puVar13[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar16;
        local_188._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_188._M_string_length = puVar13[1];
      *puVar13 = psVar16;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      Result::Result(pRVar25,INVALID_MODEL_PARAMETERS,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        uVar20 = local_188.field_2._M_allocated_capacity + 1;
        _Var21._M_p = local_188._M_dataplus._M_p;
        goto LAB_002e67d1;
      }
      break;
    }
    if (layer->_oneof_case_[0] == 0x465) {
      LVar9 = layer->layer_;
    }
    else {
      LVar9.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
    }
    plVar10 = google::protobuf::RepeatedField<long>::Get(&(LVar9.reshape_)->targetshape_,iVar26);
    iVar3 = (int)*plVar10;
    local_160 = (long *)CONCAT44(local_160._4_4_,iVar3);
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    p_Var14 = &p_Var1->_M_header;
    for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
        p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < iVar3]) {
      if (iVar3 <= (int)*(size_t *)(p_Var4 + 1)) {
        p_Var14 = p_Var4;
      }
    }
    p_Var24 = p_Var1;
    if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
       (p_Var24 = (_Rb_tree_header *)p_Var14,
       iVar3 < (int)((_Rb_tree_header *)p_Var14)->_M_node_count)) {
      p_Var24 = p_Var1;
    }
    if (p_Var24 == p_Var1) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,(int *)&local_160);
    }
    else {
      psVar5 = (layer->name_).ptr_;
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      pcVar6 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar6,pcVar6 + psVar5->_M_string_length);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x32aac2);
      ppiVar15 = (int **)(plVar10 + 2);
      if ((int **)*plVar10 == ppiVar15) {
        local_b0 = *ppiVar15;
        _Stack_a8._M_p = (pointer)plVar10[3];
        local_c0._0_8_ = &local_b0;
      }
      else {
        local_b0 = *ppiVar15;
        local_c0._0_8_ = (int **)*plVar10;
      }
      local_c0._8_8_ = plVar10[1];
      *plVar10 = (long)ppiVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_c0);
      psVar16 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar16) {
        local_e8._0_8_ = *psVar16;
        local_e8._8_8_ = plVar10[3];
        local_f8 = (undefined1  [8])local_e8;
      }
      else {
        local_e8._0_8_ = *psVar16;
        local_f8 = (undefined1  [8])*plVar10;
      }
      local_f0._M_p = (pointer)plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((int **)local_c0._0_8_ != &local_b0) {
        operator_delete((void *)local_c0._0_8_,(long)local_b0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      Result::Result(local_140,INVALID_MODEL_PARAMETERS,(string *)local_f8);
      if (local_f8 != (undefined1  [8])local_e8) {
        operator_delete((void *)local_f8,local_e8._0_8_ + 1);
      }
    }
    iVar26 = iVar26 + 1;
  } while (p_Var24 == &local_60._M_impl.super__Rb_tree_header);
  goto LAB_002e67d6;
  while (iVar26 = iVar26 + 1, iVar3 != iVar26) {
LAB_002e6247:
    if (layer->_oneof_case_[0] == 0x465) {
      LVar9 = layer->layer_;
    }
    else {
      LVar9.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
    }
    plVar10 = google::protobuf::RepeatedField<long>::Get(&(LVar9.reshape_)->targetshape_,iVar26);
    local_164 = ((int)*plVar10 >> 0x1f & local_168) + (int)*plVar10;
    _Var12 = std::
             __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       (local_118,iStack_110._M_current,&local_164);
    iVar7._M_current = iStack_110._M_current;
    if (_Var12._M_current == iStack_110._M_current) {
      if (iStack_110._M_current == local_108) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_118,iStack_110,&local_164);
      }
      else {
        *iStack_110._M_current = local_164;
        iStack_110._M_current = iStack_110._M_current + 1;
      }
    }
    else {
      psVar5 = (layer->name_).ptr_;
      local_138[0] = local_128;
      pcVar6 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_138,pcVar6,pcVar6 + psVar5->_M_string_length);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_138,0,(char *)0x0,0x32aac2);
      local_160 = &local_150;
      plVar17 = plVar10 + 2;
      if ((long *)*plVar10 == plVar17) {
        local_150 = *plVar17;
        lStack_148 = plVar10[3];
      }
      else {
        local_150 = *plVar17;
        local_160 = (long *)*plVar10;
      }
      local_158 = plVar10[1];
      *plVar10 = (long)plVar17;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      psVar16 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_188.field_2._M_allocated_capacity = *psVar16;
        local_188.field_2._8_8_ = puVar13[3];
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar16;
        local_188._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_188._M_string_length = puVar13[1];
      *puVar13 = psVar16;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      if (local_160 != &local_150) {
        operator_delete(local_160,local_150 + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      Result::Result(local_140,INVALID_MODEL_PARAMETERS,&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
    }
    if (_Var12._M_current != iVar7._M_current) goto LAB_002e67b9;
  }
LAB_002e6441:
  pRVar25 = local_140;
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_118->_M_local_buf + 4);
  paVar19 = paVar18;
  paVar22 = local_118;
  paVar23 = local_118;
  if (paVar18 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_110._M_current &&
      local_118 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_110._M_current) {
    do {
      paVar22 = paVar19;
      if (*(int *)paVar19 <= *(int *)paVar23) {
        paVar22 = paVar23;
      }
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar19 + 4);
      paVar23 = paVar22;
    } while (paVar19 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)iStack_110._M_current);
  }
  paVar19 = local_118;
  paVar23 = local_118;
  if (paVar18 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_110._M_current &&
      local_118 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_110._M_current) {
    do {
      paVar23 = paVar18;
      if (*(int *)paVar19 <= *(int *)paVar18) {
        paVar23 = paVar19;
      }
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar18 + 4);
      paVar19 = paVar23;
    } while (paVar18 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)iStack_110._M_current);
  }
  if ((*(int *)paVar22 < (int)local_168) && (-1 < *(int *)paVar23)) {
    if (local_118 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_118,(long)local_108 - (long)local_118);
    }
LAB_002e64e4:
    *(size_type **)pRVar25 = local_88;
    paVar18 = &(pRVar25->m_message).field_2;
    (pRVar25->m_message)._M_dataplus._M_p = (pointer)paVar18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p == &local_70) {
      paVar18->_M_allocated_capacity =
           CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]);
      *(undefined8 *)((long)&(pRVar25->m_message).field_2 + 8) = local_70._8_8_;
    }
    else {
      (pRVar25->m_message)._M_dataplus._M_p = local_80._M_p;
      (pRVar25->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]);
    }
    (pRVar25->m_message)._M_string_length = local_78;
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_80._M_p = (pointer)&local_70;
  }
  else {
    psVar5 = (layer->name_).ptr_;
    pcVar6 = (psVar5->_M_dataplus)._M_p;
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,pcVar6,pcVar6 + psVar5->_M_string_length);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_138,0,(char *)0x0,0x32aac2);
    plVar17 = plVar10 + 2;
    if ((long *)*plVar10 == plVar17) {
      local_150 = *plVar17;
      lStack_148 = plVar10[3];
      local_160 = &local_150;
    }
    else {
      local_150 = *plVar17;
      local_160 = (long *)*plVar10;
    }
    local_158 = plVar10[1];
    *plVar10 = (long)plVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    psVar16 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_188.field_2._M_allocated_capacity = *psVar16;
      local_188.field_2._8_8_ = puVar13[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = *psVar16;
      local_188._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_188._M_string_length = puVar13[1];
    *puVar13 = psVar16;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    if (local_160 != &local_150) {
      operator_delete(local_160,local_150 + 1);
    }
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
    Result::Result(pRVar25,INVALID_MODEL_PARAMETERS,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
LAB_002e67b9:
    if (local_118 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar20 = (long)local_108 - (long)local_118;
      _Var21._M_p = (pointer)local_118;
LAB_002e67d1:
      operator_delete(_Var21._M_p,uVar20);
    }
  }
LAB_002e67d6:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  __return_storage_ptr__ = local_140;
LAB_002e67e8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,
                    CONCAT71(local_70._M_allocated_capacity._1_7_,local_70._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateExpandDimsLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (layer.expanddims().axes_size() == 0) {
        std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // either all values in axes must be positive or all negative
    std::set<int> axes_set;
    for (int i=0; i<layer.expanddims().axes_size(); i++) {
        int a = (int)layer.expanddims().axes(i);
        if (axes_set.find(a) != axes_set.end()) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else {
            axes_set.insert(a);
        }
    }

    if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
        int input_rank = static_cast<int>(layer.inputtensor(0).rank());
        int output_rank = static_cast<int>(layer.outputtensor(0).rank());
        int axes_length = layer.expanddims().axes_size();

        if (input_rank + axes_length != output_rank) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': input rank plus the length of the axes parameter must equal output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        std::vector<int> axes;
        for (int i=0; i<axes_length; i++) {
            int a = (int)layer.expanddims().axes(i);
            if (a < 0) {
                a = output_rank + a;
            }
            if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
            axes.push_back(a);
        }

        int max_value = *std::max_element(axes.begin(), axes.end());
        int min_value = *std::min_element(axes.begin(), axes.end());
        if (max_value > output_rank - 1 || min_value < 0) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return r;
}